

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

void Ins_JMPR(TT_ExecContext exc,FT_Long *args)

{
  ulong uVar1;
  FT_Long *args_local;
  TT_ExecContext exc_local;
  
  if ((*args == 0) && (exc->args == 0)) {
    exc->error = 0x84;
  }
  else {
    exc->IP = exc->IP + *args;
    if ((exc->IP < 0) ||
       ((0 < exc->callTop && ((exc->callStack[exc->callTop + -1].Def)->end < exc->IP)))) {
      exc->error = 0x84;
    }
    else {
      exc->step_ins = '\0';
      if ((*args < 0) &&
         (uVar1 = exc->neg_jump_counter + 1, exc->neg_jump_counter = uVar1,
         exc->neg_jump_counter_max < uVar1)) {
        exc->error = 0x8b;
      }
    }
  }
  return;
}

Assistant:

static void
  Ins_JMPR( TT_ExecContext  exc,
            FT_Long*        args )
  {
    if ( args[0] == 0 && exc->args == 0 )
    {
      exc->error = FT_THROW( Bad_Argument );
      return;
    }

    exc->IP = ADD_LONG( exc->IP, args[0] );
    if ( exc->IP < 0                                             ||
         ( exc->callTop > 0                                    &&
           exc->IP > exc->callStack[exc->callTop - 1].Def->end ) )
    {
      exc->error = FT_THROW( Bad_Argument );
      return;
    }

    exc->step_ins = FALSE;

    if ( args[0] < 0 )
    {
      if ( ++exc->neg_jump_counter > exc->neg_jump_counter_max )
        exc->error = FT_THROW( Execution_Too_Long );
    }
  }